

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * getgeneric(Table *t,TValue *key)

{
  int iVar1;
  Node *pNStack_28;
  int nx;
  Node *n;
  TValue *key_local;
  Table *t_local;
  
  pNStack_28 = mainposition(t,key);
  while( true ) {
    iVar1 = luaV_equalobj((lua_State *)0x0,&(pNStack_28->i_key).tvk,key);
    if (iVar1 != 0) {
      return &pNStack_28->i_val;
    }
    iVar1 = (pNStack_28->i_key).nk.next;
    if (iVar1 == 0) break;
    pNStack_28 = pNStack_28 + iVar1;
  }
  return &luaO_nilobject_;
}

Assistant:

static const TValue *getgeneric(Table *t, const TValue *key) {
    Node *n = mainposition(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
        if (luaV_rawequalobj(gkey(n), key))
            return gval(n);  /* that's it */
        else {
            int nx = gnext(n);
            if (nx == 0)
                return luaO_nilobject;  /* not found */
            n += nx;
        }
    }
}